

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O1

void __thiscall QDataWidgetMapper::addMapping(QDataWidgetMapper *this,QWidget *widget,int section)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  QModelIndex local_a0;
  WidgetMapper local_88;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  removeMapping(this,widget);
  if (widget == (QWidget *)0x0) {
    local_88.widget.wp.d = (Data *)0x0;
  }
  else {
    local_88.widget.wp.d =
         (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
  }
  plVar2 = *(long **)(lVar1 + 0x78);
  local_88.widget.wp.value = &widget->super_QObject;
  local_88.section = section;
  if (*(int *)(lVar1 + 0x88) == 1) {
    iVar3 = QPersistentModelIndex::row();
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_50,(QPersistentModelIndex *)(lVar1 + 0x90));
    lVar5 = *plVar2;
    iVar4 = section;
  }
  else {
    iVar4 = QPersistentModelIndex::column();
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_50,(QPersistentModelIndex *)(lVar1 + 0x90));
    lVar5 = *plVar2;
    iVar3 = section;
  }
  (**(code **)(lVar5 + 0x60))(&local_a0,plVar2,iVar3,iVar4,&local_50);
  QPersistentModelIndex::QPersistentModelIndex(&local_88.currentIndex,&local_a0);
  local_88.property.d.d = (Data *)0x0;
  local_88.property.d.ptr = (char *)0x0;
  local_88.property.d.size = 0;
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::emplace_back<QDataWidgetMapperPrivate::WidgetMapper>
            ((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
              *)(lVar1 + 0xa0),&local_88);
  if (&(local_88.property.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.property.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.property.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.property.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.property.d.d)->super_QArrayData,1,0x10);
    }
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_88.currentIndex);
  if (local_88.widget.wp.d != (Data *)0x0) {
    LOCK();
    *(int *)local_88.widget.wp.d = *(int *)local_88.widget.wp.d + -1;
    UNLOCK();
    if ((*(int *)local_88.widget.wp.d == 0) && (local_88.widget.wp.d != (Data *)0x0)) {
      operator_delete(local_88.widget.wp.d);
    }
  }
  QObject::installEventFilter(&widget->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::addMapping(QWidget *widget, int section)
{
    Q_D(QDataWidgetMapper);

    removeMapping(widget);
    d->widgetMap.push_back({widget, section, d->indexAt(section), QByteArray()});
    widget->installEventFilter(d->delegate);
}